

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
llvm::sys::Process::FindInEnvPath
          (Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Process *this,StringRef EnvName,StringRef FileName,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          IgnoreList)

{
  SmallVector<llvm::StringRef,_8U> *__s;
  StringRef S;
  bool bVar1;
  undefined8 uVar2;
  size_t sVar3;
  char *pcVar4;
  StringRef Name;
  StringRef local_2f8;
  string local_2e8;
  Twine local_2c8;
  Twine local_2b0;
  Twine local_298;
  Twine local_280;
  Twine local_268;
  char *local_250;
  char *local_248;
  undefined1 local_240 [8];
  SmallString<128U> FilePath;
  char *local_1a8;
  StringRef Dir;
  iterator __end1;
  iterator __begin1;
  SmallVector<llvm::StringRef,_8U> *__range1;
  StringRef local_170;
  undefined1 local_160 [8];
  SmallVector<llvm::StringRef,_8U> Dirs;
  char EnvPathSeparatorStr [2];
  undefined1 local_b8 [8];
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> OptPath
  ;
  Twine local_88;
  undefined1 local_70 [8];
  StringRef FileName_local;
  StringRef EnvName_local;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *FoundPath;
  
  FileName_local.Data = FileName.Data;
  pcVar4 = (char *)EnvName.Length;
  Name.Data = EnvName.Data;
  local_70 = (undefined1  [8])pcVar4;
  FileName_local.Length = (size_t)this;
  Twine::Twine(&local_88,(StringRef *)local_70);
  bVar1 = sys::path::is_absolute(&local_88,native);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!path::is_absolute(FileName)",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Process.cpp"
                  ,0x26,
                  "static Optional<std::string> llvm::sys::Process::FindInEnvPath(StringRef, StringRef, ArrayRef<std::string>)"
                 );
  }
  OptPath.Storage._39_1_ = 0;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Optional(__return_storage_ptr__);
  Name.Length = (size_t)pcVar4;
  GetEnv_abi_cxx11_((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_b8,(Process *)FileName_local.Length,Name);
  bVar1 = Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::hasValue((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_b8);
  if (bVar1) {
    Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[10] = ':';
    Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xb] = '\0';
    SmallVector<llvm::StringRef,_8U>::SmallVector((SmallVector<llvm::StringRef,_8U> *)local_160);
    Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b8);
    uVar2 = std::__cxx11::string::data();
    local_170.Data = (char *)uVar2;
    uVar2 = std::__cxx11::string::length();
    local_170.Length = uVar2;
    __s = (SmallVector<llvm::StringRef,_8U> *)
          (Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
           super_AlignedCharArray<8UL,_16UL>.buffer + 10);
    __range1 = __s;
    if (__s != (SmallVector<llvm::StringRef,_8U> *)0x0) {
      strlen((char *)__s);
    }
    SplitString(local_170,(SmallVectorImpl<llvm::StringRef> *)local_160,___range1);
    __end1 = (iterator)local_160;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)local_160);
    Dir.Length = (long)local_160 + sVar3 * 0x10;
    for (; __end1 != (iterator)Dir.Length; __end1 = __end1 + 1) {
      local_1a8 = __end1->Data;
      Dir.Data = (char *)__end1->Length;
      if (Dir.Data != (char *)0x0) {
        FilePath.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
        _120_8_ = &local_1a8;
        bVar1 = any_of<llvm::ArrayRef<std::__cxx11::string>&,llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                          (&IgnoreList,
                           (anon_class_8_1_ba1cc7cd_for__M_pred)
                           FilePath.super_SmallVector<char,_128U>.
                           super_SmallVectorStorage<char,_128U>.InlineElts._120_8_);
        if (!bVar1) {
          local_250 = local_1a8;
          local_248 = Dir.Data;
          S.Length = (size_t)Dir.Data;
          S.Data = local_1a8;
          SmallString<128U>::SmallString((SmallString<128U> *)local_240,S);
          Twine::Twine(&local_268,(StringRef *)local_70);
          Twine::Twine(&local_280,"");
          Twine::Twine(&local_298,"");
          Twine::Twine(&local_2b0,"");
          sys::path::append((SmallVectorImpl<char> *)local_240,&local_268,&local_280,&local_298,
                            &local_2b0);
          Twine::Twine(&local_2c8,(SmallVectorImpl<char> *)local_240);
          bVar1 = sys::fs::exists(&local_2c8);
          if (bVar1) {
            local_2f8 = SmallString<128U>::str((SmallString<128U> *)local_240);
            StringRef::operator_cast_to_string(&local_2e8,&local_2f8);
            Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator=(__return_storage_ptr__,&local_2e8);
            std::__cxx11::string::~string((string *)&local_2e8);
            Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
            super_AlignedCharArray<8UL,_16UL>.buffer[0xc] = '\x02';
            Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
            super_AlignedCharArray<8UL,_16UL>.buffer[0xd] = '\0';
            Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
            super_AlignedCharArray<8UL,_16UL>.buffer[0xe] = '\0';
            Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
            super_AlignedCharArray<8UL,_16UL>.buffer[0xf] = '\0';
          }
          else {
            Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
            super_AlignedCharArray<8UL,_16UL>.buffer[0xc] = '\0';
            Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
            super_AlignedCharArray<8UL,_16UL>.buffer[0xd] = '\0';
            Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
            super_AlignedCharArray<8UL,_16UL>.buffer[0xe] = '\0';
            Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
            super_AlignedCharArray<8UL,_16UL>.buffer[0xf] = '\0';
          }
          SmallString<128U>::~SmallString((SmallString<128U> *)local_240);
          if (Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
              super_AlignedCharArray<8UL,_16UL>.buffer._12_4_ != 0) break;
        }
      }
    }
    OptPath.Storage._39_1_ = 1;
    Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xc] = '\x01';
    Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xd] = '\0';
    Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xe] = '\0';
    Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xf] = '\0';
    SmallVector<llvm::StringRef,_8U>::~SmallVector((SmallVector<llvm::StringRef,_8U> *)local_160);
  }
  else {
    OptPath.Storage._39_1_ = 1;
    Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xc] = '\x01';
    Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xd] = '\0';
    Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xe] = '\0';
    Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xf] = '\0';
  }
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Optional((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_b8);
  if ((OptPath.Storage._39_1_ & 1) == 0) {
    Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Optional<std::string> Process::FindInEnvPath(StringRef EnvName,
                                             StringRef FileName,
                                             ArrayRef<std::string> IgnoreList) {
  assert(!path::is_absolute(FileName));
  Optional<std::string> FoundPath;
  Optional<std::string> OptPath = Process::GetEnv(EnvName);
  if (!OptPath.hasValue())
    return FoundPath;

  const char EnvPathSeparatorStr[] = {EnvPathSeparator, '\0'};
  SmallVector<StringRef, 8> Dirs;
  SplitString(OptPath.getValue(), Dirs, EnvPathSeparatorStr);

  for (StringRef Dir : Dirs) {
    if (Dir.empty())
      continue;

    if (any_of(IgnoreList, [&](StringRef S) { return fs::equivalent(S, Dir); }))
      continue;

    SmallString<128> FilePath(Dir);
    path::append(FilePath, FileName);
    if (fs::exists(Twine(FilePath))) {
      FoundPath = FilePath.str();
      break;
    }
  }

  return FoundPath;
}